

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIDoubleValueImpl::~FIDoubleValueImpl(FIDoubleValueImpl *this)

{
  ~FIDoubleValueImpl(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

inline FIDoubleValueImpl(std::vector<double> &&value_): strValueValid(false) { value = std::move(value_); }